

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O3

Status __thiscall
sentencepiece::SentencePieceProcessor::Normalize
          (SentencePieceProcessor *this,string_view input,string *normalized,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *norm_to_orig)

{
  long *plVar1;
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  plVar1 = *(long **)(input._M_len + 0x10);
  if (plVar1 == (long *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"src/sentencepiece_processor.cc",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"(",1);
    std::ostream::operator<<((ostream *)local_188,0x3af);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"normalizer_",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"] ",2);
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
    std::__cxx11::ostringstream::~ostringstream(local_188);
    std::ios_base::~ios_base(local_118);
  }
  else {
    (**(code **)(*plVar1 + 0x20))(this,plVar1,input._M_str);
  }
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this;
}

Assistant:

util::Status SentencePieceProcessor::Normalize(
    absl::string_view input, std::string *normalized,
    std::vector<size_t> *norm_to_orig) const {
  CHECK_OR_RETURN(normalizer_);
  return normalizer_->Normalize(input, normalized, norm_to_orig);
}